

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVPathRemote.cpp
# Opt level: O3

void __thiscall adios2::EVPathRemote::InitCMData(EVPathRemote *this)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  anon_class_8_1_ba1d2be6 __callable;
  EVPathRemote *local_20;
  EVPathRemote **local_18;
  
  CManagerSingleton::Instance(&this->ev_state);
  local_18 = &local_20;
  local_20 = this;
  plVar2 = (long *)__tls_get_addr(&PTR_00878c00);
  *plVar2 = (long)&local_18;
  puVar3 = (undefined8 *)__tls_get_addr(&PTR_00879318);
  *puVar3 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  iVar1 = pthread_once(&InitCMData::flag._M_once,__once_proxy);
  if (iVar1 == 0) {
    *plVar2 = 0;
    *puVar3 = 0;
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void EVPathRemote::InitCMData()
{
    (void)CManagerSingleton::Instance(ev_state);
    static std::once_flag flag;
    std::call_once(flag, [&]() {
        CMregister_handler(ev_state.OpenResponseFormat, (CMHandlerFunc)OpenResponseHandler,
                           &ev_state);
        CMregister_handler(ev_state.ReadResponseFormat, (CMHandlerFunc)ReadResponseHandler,
                           &ev_state);
        CMregister_handler(ev_state.OpenSimpleResponseFormat,
                           (CMHandlerFunc)OpenSimpleResponseHandler, &ev_state);
        CMregister_handler(ev_state.ReadResponseFormat, (CMHandlerFunc)ReadResponseHandler,
                           &ev_state);
    });
}